

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaInfo::SchemaInfo
          (SchemaInfo *this,unsigned_short elemAttrDefaultQualified,int blockDefault,
          int finalDefault,int targetNSURI,NamespaceScope *currNamespaceScope,XMLCh *schemaURL,
          XMLCh *targetNSURIString,DOMElement *root,XMLScanner *xmlScanner,MemoryManager *manager)

{
  RefVectorOf<xercesc_4_0::SchemaInfo> *this_00;
  ValueVectorOf<xercesc_4_0::DOMNode_*> *this_01;
  ValidationContextImpl *this_02;
  NamespaceScope *this_03;
  XMLCh *pXVar1;
  
  this->fAdoptInclude = false;
  this->fProcessed = false;
  this->fElemAttrDefaultQualified = elemAttrDefaultQualified;
  this->fBlockDefault = blockDefault;
  this->fFinalDefault = finalDefault;
  this->fTargetNSURI = targetNSURI;
  this->fNamespaceScope = (NamespaceScope *)0x0;
  this->fSchemaRootElement = root;
  this->fIncludeInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0;
  this->fImportedInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0;
  this->fImportingInfoList = (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0;
  this->fFailedRedefineList = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0;
  this->fRecursingAnonTypes = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0;
  this->fRecursingTypeNames = (ValueVectorOf<const_char16_t_*> *)0x0;
  this->fNonXSAttList = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0;
  this->fValidationContext = (ValidationContext *)0x0;
  this->fMemoryManager = manager;
  this_00 = (RefVectorOf<xercesc_4_0::SchemaInfo> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::SchemaInfo>::RefVectorOf(this_00,4,false,this->fMemoryManager);
  this->fImportingInfoList = this_00;
  this->fTopLevelComponents[0] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[1] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[2] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[3] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[4] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[5] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fTopLevelComponents[6] =
       (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0;
  this->fLastTopLevelComponent[0] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[1] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[2] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[3] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[4] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[5] = (DOMElement *)0x0;
  this->fLastTopLevelComponent[6] = (DOMElement *)0x0;
  this_01 = (ValueVectorOf<xercesc_4_0::DOMNode_*> *)
            XMemory::operator_new(0x28,this->fMemoryManager);
  ValueVectorOf<xercesc_4_0::DOMNode_*>::ValueVectorOf(this_01,2,this->fMemoryManager,false);
  this->fNonXSAttList = this_01;
  this_02 = (ValidationContextImpl *)XMemory::operator_new(0x48,this->fMemoryManager);
  ValidationContextImpl::ValidationContextImpl(this_02,this->fMemoryManager);
  this->fValidationContext = (ValidationContext *)this_02;
  this_03 = (NamespaceScope *)XMemory::operator_new(0x50,this->fMemoryManager);
  NamespaceScope::NamespaceScope(this_03,currNamespaceScope,this->fMemoryManager);
  this->fNamespaceScope = this_03;
  pXVar1 = XMLString::replicate(schemaURL,this->fMemoryManager);
  this->fCurrentSchemaURL = pXVar1;
  pXVar1 = XMLString::replicate(targetNSURIString,this->fMemoryManager);
  this->fTargetNSURIString = pXVar1;
  (*this->fValidationContext->_vptr_ValidationContext[0x10])(this->fValidationContext,xmlScanner);
  (*this->fValidationContext->_vptr_ValidationContext[0x11])
            (this->fValidationContext,this->fNamespaceScope);
  return;
}

Assistant:

SchemaInfo::SchemaInfo(const unsigned short elemAttrDefaultQualified,
                       const int blockDefault,
                       const int finalDefault,
                       const int targetNSURI,
                       const NamespaceScope* const currNamespaceScope,
                       const XMLCh* const schemaURL,
                       const XMLCh* const targetNSURIString,
                       const DOMElement* const root,
                       XMLScanner* xmlScanner,
                       MemoryManager* const manager)
    : fAdoptInclude(false)
    , fProcessed(false)
    , fElemAttrDefaultQualified(elemAttrDefaultQualified)
    , fBlockDefault(blockDefault)
    , fFinalDefault(finalDefault)
    , fTargetNSURI(targetNSURI)
    , fNamespaceScope(0)
    , fSchemaRootElement(root)
    , fIncludeInfoList(0)
    , fImportedInfoList(0)
    , fImportingInfoList(0)
    , fFailedRedefineList(0)
    , fRecursingAnonTypes(0)
    , fRecursingTypeNames(0)
    , fNonXSAttList(0)
    , fValidationContext(0)
    , fMemoryManager(manager)
{
    fImportingInfoList = new (fMemoryManager) RefVectorOf<SchemaInfo>(4, false, fMemoryManager);

	memset(
         fTopLevelComponents,
         0,
         sizeof(fTopLevelComponents[0]) * C_Count);
    memset(
         fLastTopLevelComponent,
         0,
         sizeof(fLastTopLevelComponent[0]) * C_Count);

    fNonXSAttList = new (fMemoryManager) ValueVectorOf<DOMNode*>(2, fMemoryManager);
    fValidationContext = new (fMemoryManager) ValidationContextImpl(fMemoryManager);
    fNamespaceScope = new (fMemoryManager) NamespaceScope(currNamespaceScope, fMemoryManager);
    fCurrentSchemaURL = XMLString::replicate(schemaURL, fMemoryManager);
	fTargetNSURIString = XMLString::replicate(targetNSURIString, fMemoryManager);

    fValidationContext->setScanner (xmlScanner);
    fValidationContext->setNamespaceScope(fNamespaceScope);
}